

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_fwd.hpp
# Opt level: O0

void __thiscall toml::detail::region::region(region *this,region *param_2)

{
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RSI;
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  
  std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::shared_ptr
            (in_RSI,in_RDI);
  std::__cxx11::string::string(in_stack_00000020,in_stack_00000018);
  memcpy(in_RDI + 3,in_RSI + 3,0x38);
  return;
}

Assistant:

region(region&&)      = default;